

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O2

int read_intra_segment_id(AV1_COMMON *cm,MACROBLOCKD *xd,BLOCK_SIZE bsize,aom_reader *r,int skip)

{
  int iVar1;
  int iVar2;
  int mi_stride;
  int iVar3;
  uint y_mis;
  uint x_mis;
  
  if ((cm->seg).enabled == '\0') {
    iVar3 = 0;
  }
  else {
    iVar1 = xd->mi_row;
    iVar2 = xd->mi_col;
    mi_stride = (cm->mi_params).mi_cols;
    x_mis = mi_stride - iVar2;
    if ((int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                   [bsize] <= (int)x_mis) {
      x_mis = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                    [bsize];
    }
    y_mis = (cm->mi_params).mi_rows - iVar1;
    if ((int)(uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                   [bsize] <= (int)y_mis) {
      y_mis = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                    [bsize];
    }
    iVar3 = read_segment_id(cm,xd,r,skip);
    set_segment_id(cm->cur_frame->seg_map,mi_stride * iVar1 + iVar2,x_mis,y_mis,mi_stride,
                   (uint8_t)iVar3);
  }
  return iVar3;
}

Assistant:

static int read_intra_segment_id(AV1_COMMON *const cm,
                                 const MACROBLOCKD *const xd, BLOCK_SIZE bsize,
                                 aom_reader *r, int skip) {
  struct segmentation *const seg = &cm->seg;
  if (!seg->enabled) return 0;  // Default for disabled segmentation
  assert(seg->update_map && !seg->temporal_update);

  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;
  const int mi_stride = cm->mi_params.mi_cols;
  const int mi_offset = mi_row * mi_stride + mi_col;
  const int bw = mi_size_wide[bsize];
  const int bh = mi_size_high[bsize];
  const int x_mis = AOMMIN(mi_params->mi_cols - mi_col, bw);
  const int y_mis = AOMMIN(mi_params->mi_rows - mi_row, bh);
  const int segment_id = read_segment_id(cm, xd, r, skip);
  set_segment_id(cm->cur_frame->seg_map, mi_offset, x_mis, y_mis, mi_stride,
                 segment_id);
  return segment_id;
}